

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_transcoder.cpp
# Opt level: O0

int __thiscall
basist::basisu_transcoder::find_first_slice_index
          (basisu_transcoder *this,void *pData,uint32_t data_size,uint32_t image_index,
          uint32_t level_index)

{
  uint32_t uVar1;
  packed_uint *this_00;
  uint32_t in_ECX;
  long in_RSI;
  uint32_t in_R8D;
  basis_slice_desc *slice_desc;
  uint32_t slice_iter;
  uint8_t *pDataU8;
  basis_file_header *pHeader;
  undefined4 in_stack_ffffffffffffffc0;
  uint uVar2;
  uint uVar3;
  
  uVar2 = 0;
  while( true ) {
    uVar3 = uVar2;
    uVar1 = basisu::packed_uint::operator_cast_to_unsigned_int((packed_uint *)(in_RSI + 0xe));
    if (uVar1 <= uVar2) {
      return -1;
    }
    uVar1 = basisu::packed_uint::operator_cast_to_unsigned_int
                      ((packed_uint<4U> *)CONCAT44(uVar3,in_stack_ffffffffffffffc0));
    this_00 = (packed_uint *)(in_RSI + (ulong)uVar1 + (ulong)uVar3 * 0x17);
    uVar1 = basisu::packed_uint::operator_cast_to_unsigned_int(this_00);
    if ((uVar1 == in_ECX) &&
       (uVar1 = basisu::packed_uint::operator_cast_to_unsigned_int(this_00 + 3), uVar1 == in_R8D))
    break;
    uVar2 = uVar3 + 1;
  }
  return uVar3;
}

Assistant:

int basisu_transcoder::find_first_slice_index(const void* pData, uint32_t data_size, uint32_t image_index, uint32_t level_index) const
	{
		BASISU_NOTE_UNUSED(data_size);

		const basis_file_header* pHeader = reinterpret_cast<const basis_file_header*>(pData);
		const uint8_t* pDataU8 = static_cast<const uint8_t*>(pData);

		// For very large basis files this search could be painful
		// TODO: Binary search this
		for (uint32_t slice_iter = 0; slice_iter < pHeader->m_total_slices; slice_iter++)
		{
			const basis_slice_desc& slice_desc = reinterpret_cast<const basis_slice_desc*>(pDataU8 + pHeader->m_slice_desc_file_ofs)[slice_iter];
			if ((slice_desc.m_image_index == image_index) && (slice_desc.m_level_index == level_index))
				return slice_iter;
		}

		BASISU_DEVEL_ERROR("basisu_transcoder::find_first_slice_index: didn't find slice\n");

		return -1;
	}